

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-wizard.c
# Opt level: O2

void wiz_create_item_subdisplay
               (menu_conflict *m,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t width)

{
  artifact *paVar1;
  void *pvVar2;
  object *obj;
  object_kind *k;
  object *dest;
  long lVar3;
  char *fmt;
  object *local_d0;
  char buf [70];
  char name [70];
  
  pvVar2 = menu_priv(m);
  paVar1 = a_info;
  lVar3 = (long)*(int *)((long)pvVar2 + (long)oid * 4);
  if (lVar3 == -9999) {
    object_base_name(name,0x46,*(wchar_t *)((long)pvVar2 + (long)oid * 4 + 4),true);
    fmt = "All %s";
    if (choose_artifact != false) {
      fmt = "All artifact %s";
    }
    strnfmt(buf,0x46,fmt,name);
  }
  else if (choose_artifact == true) {
    obj = object_new();
    name._0_8_ = obj;
    k = lookup_kind(paVar1[lVar3].tval,paVar1[lVar3].sval);
    if (k != (object_kind *)0x0) {
      object_prep(obj,k,L'\0',RANDOMISE);
      obj->artifact = paVar1 + lVar3;
      dest = object_new();
      obj->known = dest;
      local_d0 = dest;
      object_copy(dest,obj);
      dest->notice = dest->notice | 8;
      object_desc(buf,0x46,obj,0x30,(player *)0x0);
      object_delete((chunk *)0x0,(chunk *)0x0,&local_d0);
      obj->known = (object *)0x0;
      object_delete((chunk *)0x0,(chunk *)0x0,(object **)name);
    }
  }
  else {
    object_kind_name(buf,0x46,k_info + lVar3,true);
  }
  c_prt(curs_attrs[1][cursor],buf,row,col);
  return;
}

Assistant:

static void wiz_create_item_subdisplay(struct menu *m, int oid, bool cursor,
	int row, int col, int width)
{
	int *choices = menu_priv(m);
	int selected = choices[oid];
	char buf[70];

	if (selected == WIZ_CREATE_ALL_MENU_ITEM) {
		/*
		 * Super big hack: the special flag should be the last menu
		 * item, with the selected tval stored in the next element.
		 */
		int current_tval = choices[oid + 1];
		char name[70];

		object_base_name(name, sizeof(name), current_tval, true);
		if (choose_artifact) {
			strnfmt(buf, sizeof(buf), "All artifact %s", name);
		} else {
			strnfmt(buf, sizeof(buf), "All %s", name);
		}
	} else {
		if (choose_artifact) {
			get_art_name(buf, sizeof(buf), selected);
		} else {
			object_kind_name(buf, sizeof(buf), &k_info[selected],
				true);
		}
	}

	c_prt(curs_attrs[CURS_KNOWN][0 != cursor], buf, row, col);
}